

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

int __thiscall cmCTestTestHandler::ProcessHandler(cmCTestTestHandler *this)

{
  pointer *this_00;
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  _Setw _Var4;
  char *pcVar5;
  ostream *poVar6;
  size_type sVar7;
  size_type sVar8;
  reference pbVar9;
  iterator __first;
  iterator __last;
  void *pvVar10;
  pointer pcVar11;
  pointer pcVar12;
  reference pcVar13;
  bool collapse;
  double dVar14;
  double dVar15;
  bool local_2481;
  float local_2440;
  undefined1 local_22a0 [8];
  cmXMLWriter xml;
  string local_2248 [32];
  undefined1 local_2228 [8];
  ostringstream cmCTestLog_msg_10;
  undefined1 local_20b0 [8];
  cmGeneratedFileStream xmlfile;
  undefined1 local_1e40 [8];
  ostringstream cmCTestLog_msg_9;
  _Self local_1cc8;
  _Self local_1cc0;
  iterator ftit_1;
  ostringstream local_1c98 [8];
  ostringstream cmCTestLog_msg_8;
  undefined1 local_1b20 [8];
  cmGeneratedFileStream ofs_1;
  undefined1 local_18b0 [8];
  ostringstream cmCTestLog_msg_7;
  __normal_iterator<cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
  local_1738;
  __normal_iterator<cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
  local_1730;
  iterator dtit;
  char *disabled_reason;
  ostringstream local_1700 [8];
  ostringstream cmCTestLog_msg_6;
  undefined1 local_1588 [8];
  cmGeneratedFileStream ofs;
  undefined1 local_1320 [8];
  ostringstream cmCTestLog_msg_5;
  char local_11a8 [8];
  char realBuf [1024];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_da0;
  string local_d88 [32];
  ostringstream local_d68 [8];
  ostringstream cmCTestLog_msg_4;
  float local_bec;
  iterator iStack_be8;
  float percent;
  _Self local_be0;
  iterator ftit;
  vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
  disabledTests;
  undefined1 local_bb0 [8];
  SetOfTests resultsSet;
  undefined1 local_b60 [8];
  ostringstream cmCTestLog_msg_3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_9e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_9e0;
  iterator j;
  ostringstream local_9b8 [8];
  ostringstream cmCTestLog_msg_2;
  string local_840 [32];
  undefined1 local_820 [8];
  ostringstream cmCTestLog_msg_1;
  double clock_finish;
  double clock_start;
  undefined1 local_690 [4];
  int total;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  failed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passed;
  cmGeneratedFileStream mLogFile;
  string local_3f8;
  ostringstream local_3d8 [8];
  ostringstream cmCTestLog_msg;
  allocator local_259;
  string local_258;
  allocator local_231;
  string local_230;
  allocator local_209;
  string local_208;
  allocator local_1e1;
  string local_1e0;
  allocator local_1b9;
  string local_1b8;
  allocator local_191;
  string local_190;
  allocator local_169;
  string local_168;
  allocator local_141;
  string local_140;
  char *local_120;
  char *val;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  cmCTestTestHandler *local_18;
  cmCTestTestHandler *this_local;
  
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"TestsToRunInformation",&local_39);
  pcVar5 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_38);
  SetTestsToRunInformation(this,pcVar5);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"UseUnion",&local_71);
  pcVar5 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_70);
  bVar2 = cmSystemTools::IsOn(pcVar5);
  SetUseUnion(this,bVar2);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"ScheduleRandom",&local_99);
  pcVar5 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_98);
  bVar2 = cmSystemTools::IsOn(pcVar5);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  if (bVar2) {
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c0,"Random",&local_c1);
    cmCTest::SetScheduleType(pcVar1,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"ParallelLevel",&local_e9);
  pcVar5 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  if (pcVar5 != (char *)0x0) {
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_110,"ParallelLevel",(allocator *)((long)&val + 7))
    ;
    pcVar5 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_110);
    iVar3 = atoi(pcVar5);
    cmCTest::SetParallelLevel(pcVar1,iVar3);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)((long)&val + 7));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"LabelRegularExpression",&local_141);
  local_120 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  if (local_120 != (char *)0x0) {
    this->UseIncludeLabelRegExpFlag = true;
    std::__cxx11::string::operator=((string *)&this->IncludeLabelRegExp,local_120);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,"ExcludeLabelRegularExpression",&local_169);
  local_120 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  if (local_120 != (char *)0x0) {
    this->UseExcludeLabelRegExpFlag = true;
    std::__cxx11::string::operator=((string *)&this->ExcludeLabelRegExp,local_120);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_190,"IncludeRegularExpression",&local_191);
  local_120 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  if (local_120 != (char *)0x0) {
    UseIncludeRegExp(this);
    SetIncludeRegExp(this,local_120);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b8,"ExcludeRegularExpression",&local_1b9);
  local_120 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  if (local_120 != (char *)0x0) {
    UseExcludeRegExp(this);
    SetExcludeRegExp(this,local_120);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e0,"ExcludeFixtureRegularExpression",&local_1e1);
  local_120 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  if (local_120 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->ExcludeFixtureRegExp,local_120);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_208,"ExcludeFixtureSetupRegularExpression",&local_209);
  local_120 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  if (local_120 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->ExcludeFixtureSetupRegExp,local_120);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_230,"ExcludeFixtureCleanupRegularExpression",&local_231);
  local_120 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  if (local_120 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->ExcludeFixtureCleanupRegExp,local_120);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_258,"RerunFailed",&local_259);
  pcVar5 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_258);
  bVar2 = cmSystemTools::IsOn(pcVar5);
  SetRerunFailed(this,bVar2);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::
  vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
  ::clear(&this->TestResults);
  std::__cxx11::ostringstream::ostringstream(local_3d8);
  pcVar5 = "Test";
  if ((this->MemCheck & 1U) != 0) {
    pcVar5 = "Memory check";
  }
  poVar6 = std::operator<<((ostream *)local_3d8,pcVar5);
  poVar6 = std::operator<<(poVar6," project ");
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&local_3f8,(SystemTools *)0x1,collapse);
  poVar6 = std::operator<<(poVar6,(string *)&local_3f8);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_3f8);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x1da,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string((string *)&mLogFile.field_0x240);
  std::__cxx11::ostringstream::~ostringstream(local_3d8);
  iVar3 = (*(this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[6])();
  if (iVar3 == 0) {
    return -1;
  }
  this_00 = &passed.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)this_00,None);
  pcVar5 = "Test";
  if ((this->MemCheck & 1U) != 0) {
    pcVar5 = "DynamicAnalysis";
  }
  cmCTestGenericHandler::StartLogFile
            (&this->super_cmCTestGenericHandler,pcVar5,(cmGeneratedFileStream *)this_00);
  this->LogFile =
       (ostream *)
       &passed.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&failed.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_690);
  dVar14 = cmsys::SystemTools::GetTime();
  ProcessDirectory(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&failed.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_690);
  dVar15 = cmsys::SystemTools::GetTime();
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&failed.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_690);
  iVar3 = (int)sVar7 + (int)sVar8;
  if (iVar3 == 0) {
    bVar2 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
    if ((!bVar2) &&
       (bVar2 = cmCTest::ShouldPrintLabels((this->super_cmCTestGenericHandler).CTest), !bVar2)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_820);
      poVar6 = std::operator<<((ostream *)local_820,"No tests were found!!!");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,500,pcVar5,false);
      std::__cxx11::string::~string(local_840);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_820);
    }
  }
  else {
    if ((((this->super_cmCTestGenericHandler).HandlerVerbose != OUTPUT_NONE) &&
        (bVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&failed.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar2)) &&
       (((this->UseIncludeRegExpFlag & 1U) != 0 || ((this->UseExcludeRegExpFlag & 1U) != 0)))) {
      std::__cxx11::ostringstream::ostringstream(local_9b8);
      poVar6 = (ostream *)std::ostream::operator<<(local_9b8,std::endl<char,std::char_traits<char>>)
      ;
      poVar6 = std::operator<<(poVar6,"The following tests passed:");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,4,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x1fb,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string((string *)&j);
      std::__cxx11::ostringstream::~ostringstream(local_9b8);
      local_9e0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&failed.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      while( true ) {
        local_9e8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&failed.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar2 = __gnu_cxx::operator!=(&local_9e0,&local_9e8);
        if (!bVar2) break;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b60);
        poVar6 = std::operator<<((ostream *)local_b60,"\t");
        pbVar9 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_9e0);
        poVar6 = std::operator<<(poVar6,(string *)pbVar9);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,4,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                     ,0x1ff,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string
                  ((string *)&resultsSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b60);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_9e0);
      }
    }
    __first = std::
              vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
              ::begin(&this->TestResults);
    __last = std::
             vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
             ::end(&this->TestResults);
    std::
    set<cmCTestTestHandler::cmCTestTestResult,cmCTestTestHandler::cmCTestTestResultLess,std::allocator<cmCTestTestHandler::cmCTestTestResult>>
    ::
    set<__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestResult*,std::vector<cmCTestTestHandler::cmCTestTestResult,std::allocator<cmCTestTestHandler::cmCTestTestResult>>>>
              ((set<cmCTestTestHandler::cmCTestTestResult,cmCTestTestHandler::cmCTestTestResultLess,std::allocator<cmCTestTestHandler::cmCTestTestResult>>
                *)local_bb0,
               (__normal_iterator<cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
                )__first._M_current,
               (__normal_iterator<cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
                )__last._M_current);
    std::
    vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ::vector((vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
              *)&ftit);
    local_be0._M_node =
         (_Base_ptr)
         std::
         set<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
         ::begin((set<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                  *)local_bb0);
    while( true ) {
      iStack_be8 = std::
                   set<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                   ::end((set<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                          *)local_bb0);
      bVar2 = std::operator!=(&local_be0,&stack0xfffffffffffff418);
      if (!bVar2) break;
      pcVar12 = std::_Rb_tree_const_iterator<cmCTestTestHandler::cmCTestTestResult>::operator->
                          (&local_be0);
      bVar2 = cmHasLiteralPrefix<std::__cxx11::string,18ul>
                        (&pcVar12->CompletionStatus,(char (*) [18])"SKIP_RETURN_CODE=");
      if (bVar2) {
LAB_005cb611:
        pcVar13 = std::_Rb_tree_const_iterator<cmCTestTestHandler::cmCTestTestResult>::operator*
                            (&local_be0);
        std::
        vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
        ::push_back((vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                     *)&ftit,pcVar13);
      }
      else {
        pcVar12 = std::_Rb_tree_const_iterator<cmCTestTestHandler::cmCTestTestResult>::operator->
                            (&local_be0);
        bVar2 = std::operator==(&pcVar12->CompletionStatus,"Disabled");
        if (bVar2) goto LAB_005cb611;
      }
      std::_Rb_tree_const_iterator<cmCTestTestHandler::cmCTestTestResult>::operator++(&local_be0);
    }
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&failed.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_2440 = (float)sVar7;
    local_bec = (local_2440 * 100.0) / (float)iVar3;
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_690);
    if ((!bVar2) && (99.0 < local_bec)) {
      local_bec = 99.0;
    }
    std::__cxx11::ostringstream::ostringstream(local_d68);
    pvVar10 = (void *)std::ostream::operator<<(local_d68,std::endl<char,std::char_traits<char>>);
    poVar6 = (ostream *)std::ostream::operator<<(pvVar10,(int)(local_bec + 0.5));
    poVar6 = std::operator<<(poVar6,"% tests passed, ");
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_690);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar7);
    poVar6 = std::operator<<(poVar6," tests failed out of ");
    pvVar10 = (void *)std::ostream::operator<<(poVar6,iVar3);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x219,pcVar5,false);
    std::__cxx11::string::~string(local_d88);
    std::__cxx11::ostringstream::~ostringstream(local_d68);
    cmCTest::GetLabelsForSubprojects_abi_cxx11_
              (&local_da0,(this->super_cmCTestGenericHandler).CTest);
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&local_da0);
    local_2481 = false;
    if (!bVar2) {
      local_2481 = cmCTest::GetSubprojectSummary((this->super_cmCTestGenericHandler).CTest);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_da0);
    if (local_2481 == false) {
      bVar2 = cmCTest::GetLabelSummary((this->super_cmCTestGenericHandler).CTest);
      if (bVar2) {
        PrintLabelSummary(this);
      }
    }
    else {
      PrintSubprojectSummary(this);
    }
    sprintf(local_11a8,"%6.2f sec",dVar15 - dVar14);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1320);
    poVar6 = std::operator<<((ostream *)local_1320,"\nTotal Test time (real) = ");
    poVar6 = std::operator<<(poVar6,local_11a8);
    std::operator<<(poVar6,"\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x226,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string((string *)&ofs.field_0x240);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1320);
    bVar2 = std::
            vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
            ::empty((vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                     *)&ftit);
    if (!bVar2) {
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_1588,None);
      std::__cxx11::ostringstream::ostringstream(local_1700);
      poVar6 = (ostream *)
               std::ostream::operator<<(local_1700,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<(poVar6,"The following tests did not run:");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x22b,pcVar5,false);
      std::__cxx11::string::~string((string *)&disabled_reason);
      std::__cxx11::ostringstream::~ostringstream(local_1700);
      cmCTestGenericHandler::StartLogFile
                (&this->super_cmCTestGenericHandler,"TestsDisabled",
                 (cmGeneratedFileStream *)local_1588);
      local_1730._M_current =
           (cmCTestTestResult *)
           std::
           vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
           ::begin((vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                    *)&ftit);
      while( true ) {
        local_1738._M_current =
             (cmCTestTestResult *)
             std::
             vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
             ::end((vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                    *)&ftit);
        bVar2 = __gnu_cxx::operator!=(&local_1730,&local_1738);
        if (!bVar2) break;
        pcVar11 = __gnu_cxx::
                  __normal_iterator<cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
                  ::operator->(&local_1730);
        poVar6 = (ostream *)std::ostream::operator<<(local_1588,pcVar11->TestCount);
        poVar6 = std::operator<<(poVar6,":");
        pcVar11 = __gnu_cxx::
                  __normal_iterator<cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
                  ::operator->(&local_1730);
        poVar6 = std::operator<<(poVar6,(string *)pcVar11);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar11 = __gnu_cxx::
                  __normal_iterator<cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
                  ::operator->(&local_1730);
        bVar2 = std::operator==(&pcVar11->CompletionStatus,"Disabled");
        if (bVar2) {
          dtit._M_current = (cmCTestTestResult *)0xb9ef23;
        }
        else {
          dtit._M_current = (cmCTestTestResult *)anon_var_dwarf_106ca1;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_18b0);
        poVar6 = std::operator<<((ostream *)local_18b0,"\t");
        _Var4 = std::setw(3);
        poVar6 = std::operator<<(poVar6,_Var4);
        pcVar11 = __gnu_cxx::
                  __normal_iterator<cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
                  ::operator->(&local_1730);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,pcVar11->TestCount);
        poVar6 = std::operator<<(poVar6," - ");
        pcVar11 = __gnu_cxx::
                  __normal_iterator<cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
                  ::operator->(&local_1730);
        poVar6 = std::operator<<(poVar6,(string *)pcVar11);
        poVar6 = std::operator<<(poVar6," (");
        poVar6 = std::operator<<(poVar6,(char *)dtit._M_current);
        poVar6 = std::operator<<(poVar6,")");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                     ,0x23a,pcVar5,false);
        std::__cxx11::string::~string((string *)&ofs_1.field_0x240);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_18b0);
        __gnu_cxx::
        __normal_iterator<cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
        ::operator++(&local_1730);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_1588);
    }
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_690);
    if (!bVar2) {
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_1b20,None);
      std::__cxx11::ostringstream::ostringstream(local_1c98);
      poVar6 = (ostream *)
               std::ostream::operator<<(local_1c98,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<(poVar6,"The following tests FAILED:");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x241,pcVar5,false);
      std::__cxx11::string::~string((string *)&ftit_1);
      std::__cxx11::ostringstream::~ostringstream(local_1c98);
      cmCTestGenericHandler::StartLogFile
                (&this->super_cmCTestGenericHandler,"TestsFailed",
                 (cmGeneratedFileStream *)local_1b20);
      local_1cc0._M_node =
           (_Base_ptr)
           std::
           set<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
           ::begin((set<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                    *)local_bb0);
      while( true ) {
        local_1cc8._M_node =
             (_Base_ptr)
             std::
             set<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
             ::end((set<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                    *)local_bb0);
        bVar2 = std::operator!=(&local_1cc0,&local_1cc8);
        if (!bVar2) break;
        pcVar12 = std::_Rb_tree_const_iterator<cmCTestTestHandler::cmCTestTestResult>::operator->
                            (&local_1cc0);
        if (pcVar12->Status != 9) {
          pcVar12 = std::_Rb_tree_const_iterator<cmCTestTestHandler::cmCTestTestResult>::operator->
                              (&local_1cc0);
          bVar2 = cmHasLiteralPrefix<std::__cxx11::string,18ul>
                            (&pcVar12->CompletionStatus,(char (*) [18])"SKIP_RETURN_CODE=");
          if (!bVar2) {
            pcVar12 = std::_Rb_tree_const_iterator<cmCTestTestHandler::cmCTestTestResult>::
                      operator->(&local_1cc0);
            bVar2 = std::operator!=(&pcVar12->CompletionStatus,"Disabled");
            if (bVar2) {
              pcVar12 = std::_Rb_tree_const_iterator<cmCTestTestHandler::cmCTestTestResult>::
                        operator->(&local_1cc0);
              poVar6 = (ostream *)std::ostream::operator<<(local_1b20,pcVar12->TestCount);
              poVar6 = std::operator<<(poVar6,":");
              pcVar12 = std::_Rb_tree_const_iterator<cmCTestTestHandler::cmCTestTestResult>::
                        operator->(&local_1cc0);
              poVar6 = std::operator<<(poVar6,(string *)pcVar12);
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e40);
              poVar6 = std::operator<<((ostream *)local_1e40,"\t");
              _Var4 = std::setw(3);
              poVar6 = std::operator<<(poVar6,_Var4);
              pcVar12 = std::_Rb_tree_const_iterator<cmCTestTestHandler::cmCTestTestResult>::
                        operator->(&local_1cc0);
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,pcVar12->TestCount);
              poVar6 = std::operator<<(poVar6," - ");
              pcVar12 = std::_Rb_tree_const_iterator<cmCTestTestHandler::cmCTestTestResult>::
                        operator->(&local_1cc0);
              poVar6 = std::operator<<(poVar6,(string *)pcVar12);
              poVar6 = std::operator<<(poVar6," (");
              pcVar13 = std::_Rb_tree_const_iterator<cmCTestTestHandler::cmCTestTestResult>::
                        operator*(&local_1cc0);
              pcVar5 = GetTestStatus(this,pcVar13);
              poVar6 = std::operator<<(poVar6,pcVar5);
              poVar6 = std::operator<<(poVar6,")");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar1,2,
                           "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                           ,0x24d,pcVar5,false);
              std::__cxx11::string::~string((string *)&xmlfile.field_0x240);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e40);
            }
          }
        }
        std::_Rb_tree_const_iterator<cmCTestTestHandler::cmCTestTestResult>::operator++(&local_1cc0)
        ;
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_1b20);
    }
    std::
    vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ::~vector((vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
               *)&ftit);
    std::
    set<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ::~set((set<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
            *)local_bb0);
  }
  bVar2 = cmCTest::GetProduceXML((this->super_cmCTestGenericHandler).CTest);
  if (bVar2) {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_20b0,None);
    pcVar5 = "Test";
    if ((this->MemCheck & 1U) != 0) {
      pcVar5 = "DynamicAnalysis";
    }
    bVar2 = cmCTestGenericHandler::StartResultingXML
                      (&this->super_cmCTestGenericHandler,(this->MemCheck & 1) * 2 + PartTest,pcVar5
                       ,(cmGeneratedFileStream *)local_20b0);
    if (bVar2) {
      cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_22a0,(ostream *)local_20b0,0);
      (*(this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[9])(this,local_22a0);
      cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_22a0);
      xml._76_4_ = 0;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2228);
      poVar6 = std::operator<<((ostream *)local_2228,"Cannot create ");
      pcVar5 = "testing";
      if ((this->MemCheck & 1U) != 0) {
        pcVar5 = "memory check";
      }
      poVar6 = std::operator<<(poVar6,pcVar5);
      poVar6 = std::operator<<(poVar6," XML file");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x25a,pcVar5,false);
      std::__cxx11::string::~string(local_2248);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2228);
      this->LogFile = (ostream *)0x0;
      this_local._4_4_ = 1;
      xml._76_4_ = 1;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_20b0);
    if (xml._76_4_ != 0) goto LAB_005cc752;
  }
  iVar3 = (*(this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[7])();
  if (iVar3 == 0) {
    this->LogFile = (ostream *)0x0;
    this_local._4_4_ = -1;
    xml._76_4_ = 1;
  }
  else {
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_690);
    if (bVar2) {
      this->LogFile = (ostream *)0x0;
      this_local._4_4_ = 0;
      xml._76_4_ = 1;
    }
    else {
      this->LogFile = (ostream *)0x0;
      this_local._4_4_ = -1;
      xml._76_4_ = 1;
    }
  }
LAB_005cc752:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_690);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&failed.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmGeneratedFileStream::~cmGeneratedFileStream
            ((cmGeneratedFileStream *)
             &passed.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return this_local._4_4_;
}

Assistant:

int cmCTestTestHandler::ProcessHandler()
{
  // Update internal data structure from generic one
  this->SetTestsToRunInformation(this->GetOption("TestsToRunInformation"));
  this->SetUseUnion(cmSystemTools::IsOn(this->GetOption("UseUnion")));
  if (cmSystemTools::IsOn(this->GetOption("ScheduleRandom"))) {
    this->CTest->SetScheduleType("Random");
  }
  if (this->GetOption("ParallelLevel")) {
    this->CTest->SetParallelLevel(atoi(this->GetOption("ParallelLevel")));
  }

  const char* val;
  val = this->GetOption("LabelRegularExpression");
  if (val) {
    this->UseIncludeLabelRegExpFlag = true;
    this->IncludeLabelRegExp = val;
  }
  val = this->GetOption("ExcludeLabelRegularExpression");
  if (val) {
    this->UseExcludeLabelRegExpFlag = true;
    this->ExcludeLabelRegExp = val;
  }
  val = this->GetOption("IncludeRegularExpression");
  if (val) {
    this->UseIncludeRegExp();
    this->SetIncludeRegExp(val);
  }
  val = this->GetOption("ExcludeRegularExpression");
  if (val) {
    this->UseExcludeRegExp();
    this->SetExcludeRegExp(val);
  }
  val = this->GetOption("ExcludeFixtureRegularExpression");
  if (val) {
    this->ExcludeFixtureRegExp = val;
  }
  val = this->GetOption("ExcludeFixtureSetupRegularExpression");
  if (val) {
    this->ExcludeFixtureSetupRegExp = val;
  }
  val = this->GetOption("ExcludeFixtureCleanupRegularExpression");
  if (val) {
    this->ExcludeFixtureCleanupRegExp = val;
  }
  this->SetRerunFailed(cmSystemTools::IsOn(this->GetOption("RerunFailed")));

  this->TestResults.clear();

  cmCTestOptionalLog(
    this->CTest, HANDLER_OUTPUT, (this->MemCheck ? "Memory check" : "Test")
      << " project " << cmSystemTools::GetCurrentWorkingDirectory()
      << std::endl,
    this->Quiet);
  if (!this->PreProcessHandler()) {
    return -1;
  }

  cmGeneratedFileStream mLogFile;
  this->StartLogFile((this->MemCheck ? "DynamicAnalysis" : "Test"), mLogFile);
  this->LogFile = &mLogFile;

  std::vector<std::string> passed;
  std::vector<std::string> failed;
  int total;

  // start the real time clock
  double clock_start, clock_finish;
  clock_start = cmSystemTools::GetTime();

  this->ProcessDirectory(passed, failed);

  clock_finish = cmSystemTools::GetTime();

  total = int(passed.size()) + int(failed.size());

  if (total == 0) {
    if (!this->CTest->GetShowOnly() && !this->CTest->ShouldPrintLabels()) {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "No tests were found!!!"
                   << std::endl);
    }
  } else {
    if (this->HandlerVerbose && !passed.empty() &&
        (this->UseIncludeRegExpFlag || this->UseExcludeRegExpFlag)) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl
                           << "The following tests passed:" << std::endl,
                         this->Quiet);
      for (std::vector<std::string>::iterator j = passed.begin();
           j != passed.end(); ++j) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "\t" << *j << std::endl, this->Quiet);
      }
    }

    typedef std::set<cmCTestTestHandler::cmCTestTestResult,
                     cmCTestTestResultLess>
      SetOfTests;
    SetOfTests resultsSet(this->TestResults.begin(), this->TestResults.end());
    std::vector<cmCTestTestHandler::cmCTestTestResult> disabledTests;

    for (SetOfTests::iterator ftit = resultsSet.begin();
         ftit != resultsSet.end(); ++ftit) {
      if (cmHasLiteralPrefix(ftit->CompletionStatus, "SKIP_RETURN_CODE=") ||
          ftit->CompletionStatus == "Disabled") {
        disabledTests.push_back(*ftit);
      }
    }

    float percent = float(passed.size()) * 100.0f / float(total);
    if (!failed.empty() && percent > 99) {
      percent = 99;
    }

    cmCTestLog(this->CTest, HANDLER_OUTPUT, std::endl
                 << static_cast<int>(percent + .5f) << "% tests passed, "
                 << failed.size() << " tests failed out of " << total
                 << std::endl);

    if (!this->CTest->GetLabelsForSubprojects().empty() &&
        this->CTest->GetSubprojectSummary()) {
      this->PrintSubprojectSummary();
    } else if (this->CTest->GetLabelSummary()) {
      this->PrintLabelSummary();
    }

    char realBuf[1024];
    sprintf(realBuf, "%6.2f sec", (double)(clock_finish - clock_start));
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "\nTotal Test time (real) = " << realBuf << "\n",
                       this->Quiet);

    if (!disabledTests.empty()) {
      cmGeneratedFileStream ofs;
      cmCTestLog(this->CTest, HANDLER_OUTPUT, std::endl
                   << "The following tests did not run:" << std::endl);
      this->StartLogFile("TestsDisabled", ofs);

      const char* disabled_reason;
      for (std::vector<cmCTestTestHandler::cmCTestTestResult>::iterator dtit =
             disabledTests.begin();
           dtit != disabledTests.end(); ++dtit) {
        ofs << dtit->TestCount << ":" << dtit->Name << std::endl;
        if (dtit->CompletionStatus == "Disabled") {
          disabled_reason = "Disabled";
        } else {
          disabled_reason = "Skipped";
        }
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "\t"
                     << std::setw(3) << dtit->TestCount << " - " << dtit->Name
                     << " (" << disabled_reason << ")" << std::endl);
      }
    }

    if (!failed.empty()) {
      cmGeneratedFileStream ofs;
      cmCTestLog(this->CTest, HANDLER_OUTPUT, std::endl
                   << "The following tests FAILED:" << std::endl);
      this->StartLogFile("TestsFailed", ofs);

      for (SetOfTests::iterator ftit = resultsSet.begin();
           ftit != resultsSet.end(); ++ftit) {
        if (ftit->Status != cmCTestTestHandler::COMPLETED &&
            !cmHasLiteralPrefix(ftit->CompletionStatus, "SKIP_RETURN_CODE=") &&
            ftit->CompletionStatus != "Disabled") {
          ofs << ftit->TestCount << ":" << ftit->Name << std::endl;
          cmCTestLog(this->CTest, HANDLER_OUTPUT, "\t"
                       << std::setw(3) << ftit->TestCount << " - "
                       << ftit->Name << " (" << this->GetTestStatus(&*ftit)
                       << ")" << std::endl);
        }
      }
    }
  }

  if (this->CTest->GetProduceXML()) {
    cmGeneratedFileStream xmlfile;
    if (!this->StartResultingXML(
          (this->MemCheck ? cmCTest::PartMemCheck : cmCTest::PartTest),
          (this->MemCheck ? "DynamicAnalysis" : "Test"), xmlfile)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot create "
                   << (this->MemCheck ? "memory check" : "testing")
                   << " XML file" << std::endl);
      this->LogFile = CM_NULLPTR;
      return 1;
    }
    cmXMLWriter xml(xmlfile);
    this->GenerateDartOutput(xml);
  }

  if (!this->PostProcessHandler()) {
    this->LogFile = CM_NULLPTR;
    return -1;
  }

  if (!failed.empty()) {
    this->LogFile = CM_NULLPTR;
    return -1;
  }
  this->LogFile = CM_NULLPTR;
  return 0;
}